

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool clipp::operator==(depth_first_traverser *a,depth_first_traverser *b)

{
  group *pgVar1;
  bool bVar2;
  bool bVar3;
  const_reference pvVar4;
  reference this;
  reference pcVar5;
  bool bEnd;
  bool aEnd;
  __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
  *in_stack_ffffffffffffffb8;
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  *in_stack_ffffffffffffffc0;
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  *in_stack_ffffffffffffffd0;
  
  bVar2 = std::
          vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ::empty(in_stack_ffffffffffffffd0);
  if ((bVar2) ||
     (bVar2 = std::
              vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ::empty(in_stack_ffffffffffffffd0), bVar2)) {
    return false;
  }
  pvVar4 = std::
           vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ::back(in_stack_ffffffffffffffc0);
  pgVar1 = pvVar4->parent;
  pvVar4 = std::
           vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ::back(in_stack_ffffffffffffffc0);
  if (pgVar1 != pvVar4->parent) {
    return false;
  }
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::back(in_stack_ffffffffffffffc0);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::back(in_stack_ffffffffffffffc0);
  bVar2 = __gnu_cxx::operator==
                    ((__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                      *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::back(in_stack_ffffffffffffffc0);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::back(in_stack_ffffffffffffffc0);
  bVar3 = __gnu_cxx::operator==
                    ((__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                      *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if ((bVar2) && (bVar3)) {
    return true;
  }
  if ((!bVar2) && (!bVar3)) {
    pvVar4 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::back(in_stack_ffffffffffffffc0);
    this = __gnu_cxx::
           __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
           ::operator*(&pvVar4->cur);
    pvVar4 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::back((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                     *)this);
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
             ::operator*(&pvVar4->cur);
    return this == pcVar5;
  }
  return false;
}

Assistant:

inline friend bool operator == (const depth_first_traverser& a,
                                        const depth_first_traverser& b)
        {
            if(a.stack_.empty() || b.stack_.empty()) return false;

            //parents not the same -> different position
            if(a.stack_.back().parent != b.stack_.back().parent) return false;

            bool aEnd = a.stack_.back().cur == a.stack_.back().end;
            bool bEnd = b.stack_.back().cur == b.stack_.back().end;
            //either both at the end of the same parent => same position
            if(aEnd && bEnd) return true;
            //or only one at the end => not at the same position
            if(aEnd || bEnd) return false;
            return std::addressof(*a.stack_.back().cur) ==
                   std::addressof(*b.stack_.back().cur);
        }